

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReader::TiledFace::~TiledFace(TiledFace *this)

{
  (this->super_TiledFaceBase).super_FaceData.super_PtexFaceData._vptr_PtexFaceData =
       (_func_int **)&PTR__TiledFace_00132ba0;
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&(this->_offsets).super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>::
  ~_Vector_base(&(this->_fdh).
                 super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
               );
  TiledFaceBase::~TiledFaceBase(&this->super_TiledFaceBase);
  return;
}

Assistant:

TiledFace(PtexReader* reader, Res resArg, Res tileresArg, int levelid)
            : TiledFaceBase(reader, resArg, tileresArg),
              _levelid(levelid)
        {
            _fdh.resize(_ntiles),
            _offsets.resize(_ntiles);
        }